

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCNSeq.cpp
# Opt level: O2

void __thiscall OpenMD::GCNSeq::writeSequence(GCNSeq *this)

{
  pointer pvVar1;
  char cVar2;
  ostream *poVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  Revision r;
  string local_250;
  ofstream ofs;
  
  std::ofstream::ofstream
            (&ofs,(this->super_SequentialAnalyzer).outputFilename_._M_dataplus._M_p,_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    snprintf(painCave.errMsg,2000,"GCN::writeSequence Error: failed to open %s\n",
             (this->super_SequentialAnalyzer).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar3 = std::operator<<((ostream *)&ofs,"# ");
    poVar3 = std::operator<<(poVar3,(string *)&(this->super_SequentialAnalyzer).sequenceType_);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&ofs,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&local_250,&r);
    poVar3 = std::operator<<(poVar3,(string *)&local_250);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_250);
    poVar3 = std::operator<<((ostream *)&ofs,"# ");
    Revision::getBuildDate_abi_cxx11_(&local_250,&r);
    poVar3 = std::operator<<(poVar3,(string *)&local_250);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_250);
    poVar3 = std::operator<<((ostream *)&ofs,"# selection script1: \"");
    std::operator<<(poVar3,(string *)&(this->super_SequentialAnalyzer).selectionScript1_);
    poVar3 = std::operator<<((ostream *)&ofs,"\"\tselection script2: \"");
    poVar3 = std::operator<<(poVar3,(string *)&(this->super_SequentialAnalyzer).selectionScript2_);
    std::operator<<(poVar3,"\"\n");
    if ((this->super_SequentialAnalyzer).paramString_._M_string_length != 0) {
      poVar3 = std::operator<<((ostream *)&ofs,"# parameters: ");
      poVar3 = std::operator<<(poVar3,(string *)&(this->super_SequentialAnalyzer).paramString_);
      std::operator<<(poVar3,"\n");
    }
    std::operator<<((ostream *)&ofs,"#time\tvalue\n");
    for (uVar6 = 0; uVar7 = (ulong)uVar6,
        uVar7 < (ulong)((long)(this->super_SequentialAnalyzer).times_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(this->super_SequentialAnalyzer).times_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
      poVar3 = std::operator<<((ostream *)&ofs,"#Frame ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<((ostream *)&ofs,"#Selection 1 Count: ");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar3,
                          (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7]);
      std::operator<<(poVar3,"\n");
      for (uVar4 = 0; uVar5 = (ulong)uVar4,
          pvVar1 = (this->histogram_).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar5 < (ulong)((long)*(pointer *)
                                 ((long)&pvVar1[uVar7].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data + 8) -
                          *(long *)&pvVar1[uVar7].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data >> 3); uVar4 = uVar4 + 1) {
        poVar3 = std::ostream::_M_insert<double>((double)uVar5 * this->delta_);
        std::operator<<(poVar3,"\t");
        poVar3 = std::ostream::_M_insert<double>
                           (*(double *)
                             (*(long *)&(this->histogram_).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data + uVar5 * 8));
        std::operator<<(poVar3,"\n");
      }
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void GCNSeq::writeSequence() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);

    if (ofs.is_open()) {
      Revision r;
      RealType binValue(0.0);

      ofs << "# " << getSequenceType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << selectionScript1_;
      ofs << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      ofs << "#time\tvalue\n";

      for (unsigned int i = 0; i < times_.size(); ++i) {
        ofs << "#Frame " << i << "\n";
        ofs << "#Selection 1 Count: " << count_[i] << "\n";

        for (unsigned int n = 0; n < histogram_[i].size(); n++) {
          binValue = n * delta_;
          ofs << binValue << "\t" << histogram_[i][n] << "\n";
        }
      }
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GCN::writeSequence Error: failed to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }